

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_proto3_unittest.pb.cc
# Opt level: O2

void __thiscall proto3_unittest::TestProto3BytesMap::~TestProto3BytesMap(TestProto3BytesMap *this)

{
  ~TestProto3BytesMap(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

TestProto3BytesMap::~TestProto3BytesMap() {
  // @@protoc_insertion_point(destructor:proto3_unittest.TestProto3BytesMap)
  SharedDtor(*this);
}